

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseVersions.h
# Opt level: O0

void __thiscall
glslang::TParseVersions::TParseVersions
          (TParseVersions *this,TIntermediate *interm,int version,EProfile profile,
          SpvVersion *spvVersion,EShLanguage language,TInfoSink *infoSink,bool forwardCompatible,
          EShMessages messages)

{
  int iVar1;
  undefined3 uVar2;
  bool forwardCompatible_local;
  EShLanguage language_local;
  SpvVersion *spvVersion_local;
  EProfile profile_local;
  int version_local;
  TIntermediate *interm_local;
  TParseVersions *this_local;
  
  this->_vptr_TParseVersions = (_func_int **)&PTR__TParseVersions_013a9eb0;
  this->forwardCompatible = forwardCompatible;
  this->profile = profile;
  this->infoSink = infoSink;
  this->version = version;
  this->language = language;
  iVar1 = spvVersion->vulkanGlsl;
  (this->spvVersion).spv = spvVersion->spv;
  (this->spvVersion).vulkanGlsl = iVar1;
  iVar1 = spvVersion->openGl;
  (this->spvVersion).vulkan = spvVersion->vulkan;
  (this->spvVersion).openGl = iVar1;
  uVar2 = *(undefined3 *)&spvVersion->field_0x11;
  (this->spvVersion).vulkanRelaxed = spvVersion->vulkanRelaxed;
  *(undefined3 *)&(this->spvVersion).field_0x11 = uVar2;
  this->intermediate = interm;
  TMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TExtensionBehavior,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ::TMap(&this->extensionBehavior);
  TMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ::TMap(&this->extensionMinSpv);
  TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  ::TVector(&this->spvUnsupportedExt);
  this->messages = messages;
  this->numErrors = 0;
  this->currentScanner = (TInputScanner *)0x0;
  return;
}

Assistant:

TParseVersions(TIntermediate& interm, int version, EProfile profile,
                   const SpvVersion& spvVersion, EShLanguage language, TInfoSink& infoSink,
                   bool forwardCompatible, EShMessages messages)
        :
        forwardCompatible(forwardCompatible),
        profile(profile),
        infoSink(infoSink), version(version), 
        language(language),
        spvVersion(spvVersion), 
        intermediate(interm), messages(messages), numErrors(0), currentScanner(nullptr) { }